

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mp3_get_data_format
                    (ma_mp3 *pMP3,ma_format *pFormat,ma_uint32 *pChannels,ma_uint32 *pSampleRate,
                    ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_channel *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  void *in_R8;
  size_t in_R9;
  ma_result local_14;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (ma_channel *)0x0) {
    in_RCX[0] = '\0';
    in_RCX[1] = '\0';
    in_RCX[2] = '\0';
    in_RCX[3] = '\0';
  }
  if (((in_R8 != (void *)0x0) && (in_R8 != (void *)0x0)) && (in_R9 != 0)) {
    memset(in_R8,0,in_R9);
  }
  if (in_RDI == 0) {
    local_14 = MA_INVALID_OPERATION;
  }
  else {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = *(undefined4 *)(in_RDI + 0x68);
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = *(undefined4 *)(in_RDI + 0x1a7c);
    }
    if (in_RCX != (ma_channel *)0x0) {
      *(undefined4 *)in_RCX = *(undefined4 *)(in_RDI + 0x1a80);
    }
    if (in_R8 != (void *)0x0) {
      ma_channel_map_init_standard
                ((ma_standard_channel_map)((ulong)in_RDX >> 0x20),in_RCX,(size_t)in_R8,
                 (ma_uint32)(in_R9 >> 0x20));
    }
    local_14 = MA_SUCCESS;
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_mp3_get_data_format(ma_mp3* pMP3, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    /* Defaults for safety. */
    if (pFormat != NULL) {
        *pFormat = ma_format_unknown;
    }
    if (pChannels != NULL) {
        *pChannels = 0;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = 0;
    }
    if (pChannelMap != NULL) {
        MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channelMapCap);
    }

    if (pMP3 == NULL) {
        return MA_INVALID_OPERATION;
    }

    if (pFormat != NULL) {
        *pFormat = pMP3->format;
    }

    #if !defined(MA_NO_MP3)
    {
        if (pChannels != NULL) {
            *pChannels = pMP3->dr.channels;
        }

        if (pSampleRate != NULL) {
            *pSampleRate = pMP3->dr.sampleRate;
        }

        if (pChannelMap != NULL) {
            ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pMP3->dr.channels);
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}